

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O1

void av1_free_cdef_sync(AV1CdefSync *cdef_sync)

{
  if ((cdef_sync != (AV1CdefSync *)0x0) && (cdef_sync->mutex_ != (pthread_mutex_t *)0x0)) {
    pthread_mutex_destroy((pthread_mutex_t *)cdef_sync->mutex_);
    aom_free(cdef_sync->mutex_);
    return;
  }
  return;
}

Assistant:

void av1_free_cdef_sync(AV1CdefSync *cdef_sync) {
  if (cdef_sync == NULL) return;
#if CONFIG_MULTITHREAD
  if (cdef_sync->mutex_ != NULL) {
    pthread_mutex_destroy(cdef_sync->mutex_);
    aom_free(cdef_sync->mutex_);
  }
#endif  // CONFIG_MULTITHREAD
}